

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void stumpless_close_stream_target(stumpless_target *target)

{
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
  }
  else if (target->type == STUMPLESS_STREAM_TARGET) {
    clear_error();
    destroy_stream_target((stream_target *)target->id);
    destroy_target(target);
  }
  else {
    raise_target_incompatible("target type is incompatible with this operation");
  }
  return;
}

Assistant:

void
stumpless_close_stream_target( const struct stumpless_target *target ) {
  if( !target ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "target" ) );
    return;
  }

  if( target->type != STUMPLESS_STREAM_TARGET ) {
    raise_target_incompatible( L10N_INVALID_TARGET_TYPE_ERROR_MESSAGE );
    return;
  }

  clear_error(  );
  destroy_stream_target( target->id );
  destroy_target( target );
}